

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall crnlib::crn_comp::optimize_alpha(crn_comp *this)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  endpoint_indices_details *peVar8;
  undefined4 uVar9;
  ushort uVar10;
  uint uVar11;
  long *pData_ptr;
  executable_task *pObj;
  uint temp_4;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  undefined4 uVar15;
  uint uVar16;
  uint uVar17;
  unsigned_short *temp_3;
  unsigned_short *puVar18;
  unsigned_short *puVar19;
  undefined2 uVar20;
  uint uVar21;
  uint uVar22;
  uint temp_1;
  uchar *temp;
  uchar *puVar23;
  uchar *puVar24;
  uint uVar25;
  uint *puVar26;
  uint uVar27;
  uint uVar28;
  undefined4 *puVar29;
  uint i;
  long lVar30;
  uint64 data;
  vector<unsigned_int> sum;
  vector<crnlib::optimize_alpha_params::unpacked_endpoint> unpacked_endpoints;
  vector<unsigned_int> hist;
  result remapping_trial [4];
  elemental_vector local_128;
  elemental_vector local_118;
  elemental_vector local_108;
  undefined8 uStack_f8;
  undefined8 local_f0;
  executable_task local_e8;
  undefined8 local_e0;
  uint local_d8 [4];
  undefined8 local_c8 [8];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  uVar25 = (this->m_alpha_endpoints).m_size;
  local_e0 = (ulong)uVar25;
  uVar10 = (ushort)uVar25;
  local_108.m_p = (void *)0x0;
  local_108.m_size = 0;
  local_108.m_capacity = 0;
  if ((ulong)uVar10 == 0) {
    local_128.m_p = (void *)0x0;
    local_128.m_size = 0;
    local_128.m_capacity = 0;
  }
  else {
    uVar14 = (uVar25 & 0xffff) * (uVar25 & 0xffff);
    elemental_vector::increase_capacity(&local_108,uVar14,uVar14 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_108._8_8_ & 0xffffffff) * 4 + (long)local_108.m_p),0,
           (ulong)(uVar14 - local_108.m_size) << 2);
    local_108.m_size = uVar14;
    local_128.m_p = (void *)0x0;
    local_128.m_size = 0;
    local_128.m_capacity = 0;
    uVar27 = uVar25 & 0xffff;
    elemental_vector::increase_capacity(&local_128,uVar27,uVar27 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_128._8_8_ & 0xffffffff) * 4 + (long)local_128.m_p),0,
           (ulong)(uVar27 - local_128.m_size) << 2);
    local_128._8_8_ = CONCAT44(local_128.m_capacity,uVar25) & 0xffffffff0000ffff;
  }
  if ((this->m_endpoint_indices).m_size != 0) {
    bVar2 = this->m_has_comp[1];
    bVar3 = this->m_has_comp[2];
    uVar13 = 0;
    uVar27 = 0;
    uVar16 = 0;
    do {
      peVar8 = (this->m_endpoint_indices).m_p;
      uVar17 = (uint)peVar8[uVar13].field_0.field_0.alpha0;
      uVar21 = (uint)peVar8[uVar13].field_0.field_0.alpha1;
      if (peVar8[uVar13].reference == '\0') {
        uVar28 = uVar25 & 0xffff;
        if ((bVar2 != false) && (uVar16 != uVar17)) {
          piVar1 = (int *)((long)local_108.m_p + (ulong)(uVar28 * uVar17 + uVar16) * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_108.m_p + (ulong)(uVar16 * uVar28 + uVar17) * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_128.m_p + (ulong)uVar17 * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_128.m_p + (ulong)uVar16 * 4);
          *piVar1 = *piVar1 + 1;
        }
        if ((bVar3 != false) && (uVar27 != uVar21)) {
          piVar1 = (int *)((long)local_108.m_p + (ulong)(uVar28 * uVar21 + uVar27) * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_108.m_p + (ulong)(uVar27 * uVar28 + uVar21) * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_128.m_p + (ulong)uVar21 * 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)((long)local_128.m_p + (ulong)uVar27 * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar13 = uVar13 + 1;
      uVar27 = uVar21;
      uVar16 = uVar17;
    } while (uVar13 < (this->m_endpoint_indices).m_size);
  }
  uVar27 = uVar25 & 0xffff;
  if (uVar27 == 0) {
    local_118.m_p = (void *)0x0;
    local_118.m_size = 0;
    local_118.m_capacity = 0;
    uVar20 = 0;
  }
  else {
    uVar13 = 0;
    uVar16 = 0;
    uVar15 = 0;
    do {
      uVar17 = *(uint *)((long)local_128.m_p + uVar13 * 4);
      uVar9 = (int)uVar13;
      if (uVar17 <= uVar16) {
        uVar9 = uVar15;
      }
      uVar15 = uVar9;
      uVar20 = (undefined2)uVar15;
      if (uVar16 <= uVar17) {
        uVar16 = uVar17;
      }
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
    local_118.m_p = (void *)0x0;
    local_118.m_size = 0;
    local_118.m_capacity = 0;
    if (uVar27 != 0) {
      elemental_vector::increase_capacity(&local_118,uVar27,uVar27 == 1,2,(object_mover)0x0,false);
      local_118._8_8_ = CONCAT44(local_118.m_capacity,uVar25) & 0xffffffff0000ffff;
      lVar30 = 0;
      do {
        uVar14 = dxt5_block::unpack_endpoint((this->m_alpha_endpoints).m_p[lVar30],0);
        *(char *)((long)local_118.m_p + lVar30 * 2) = (char)uVar14;
        uVar14 = dxt5_block::unpack_endpoint((this->m_alpha_endpoints).m_p[lVar30],1);
        *(char *)((long)local_118.m_p + lVar30 * 2 + 1) = (char)uVar14;
        lVar30 = lVar30 + 1;
      } while ((ushort)lVar30 < uVar10);
    }
  }
  puVar26 = local_d8;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  local_d8[2] = 0;
  local_d8[3] = 0;
  local_c8[3] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[6] = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_f0 = &this->m_task_pool;
  puVar29 = &DAT_001b75a0;
  data = 0;
  local_e8._vptr_executable_task = (_func_int **)&PTR_execute_task_001db8a8;
  do {
    pData_ptr = (long *)crnlib_malloc(0x20);
    *pData_ptr = (long)local_118.m_p;
    pData_ptr[1] = (long)local_108.m_p;
    *(short *)(pData_ptr + 2) = (short)local_e0;
    *(undefined2 *)((long)pData_ptr + 0x12) = uVar20;
    *(undefined4 *)((long)pData_ptr + 0x14) = *puVar29;
    pData_ptr[3] = (long)puVar26;
    pObj = (executable_task *)crnlib_malloc(0x28);
    pObj->_vptr_executable_task = local_e8._vptr_executable_task;
    pObj[1]._vptr_executable_task = (_func_int **)this;
    pObj[2]._vptr_executable_task = (_func_int **)optimize_alpha_endpoints_task;
    pObj[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
    task_pool::queue_task(local_f0,pObj,data,pData_ptr);
    data = data + 1;
    puVar29 = puVar29 + 1;
    puVar26 = puVar26 + 10;
  } while (data != 4);
  task_pool::join(local_f0);
  uVar14 = (this->m_packed_alpha_endpoints).m_size;
  uVar22 = (this->m_packed_alpha_endpoints).m_capacity;
  uVar12 = this->m_endpoint_remaping[1].m_size;
  uVar11 = this->m_endpoint_remaping[1].m_capacity;
  uVar25 = 0xffffffff;
  lVar30 = 0x20;
  puVar18 = this->m_endpoint_remaping[1].m_p;
  puVar23 = (this->m_packed_alpha_endpoints).m_p;
  do {
    uVar27 = *(uint *)((long)local_d8 + lVar30);
    puVar19 = puVar18;
    puVar24 = puVar23;
    if (uVar27 < uVar25) {
      puVar24 = *(uchar **)((long)&local_e8._vptr_executable_task + lVar30);
      (this->m_packed_alpha_endpoints).m_p = puVar24;
      *(uchar **)((long)&local_e8._vptr_executable_task + lVar30) = puVar23;
      uVar4 = *(uint *)((long)&local_e0 + lVar30);
      (this->m_packed_alpha_endpoints).m_size = uVar4;
      *(uint *)((long)&local_e0 + lVar30) = uVar14;
      uVar5 = *(uint *)((long)&local_e0 + lVar30 + 4);
      (this->m_packed_alpha_endpoints).m_capacity = uVar5;
      *(uint *)((long)&local_e0 + lVar30 + 4) = uVar22;
      puVar19 = *(unsigned_short **)((long)&uStack_f8 + lVar30);
      this->m_endpoint_remaping[1].m_p = puVar19;
      *(unsigned_short **)((long)&uStack_f8 + lVar30) = puVar18;
      uVar6 = *(uint *)((long)&local_f0 + lVar30);
      this->m_endpoint_remaping[1].m_size = uVar6;
      *(uint *)((long)&local_f0 + lVar30) = uVar12;
      uVar7 = *(uint *)((long)&local_f0 + lVar30 + 4);
      this->m_endpoint_remaping[1].m_capacity = uVar7;
      *(uint *)((long)&local_f0 + lVar30 + 4) = uVar11;
      uVar14 = uVar4;
      uVar22 = uVar5;
      uVar12 = uVar6;
      uVar11 = uVar7;
      uVar25 = uVar27;
    }
    lVar30 = lVar30 + 0x28;
    puVar18 = puVar19;
    puVar23 = puVar24;
  } while (lVar30 != 0xc0);
  lVar30 = 0x78;
  do {
    if (*(void **)((long)local_c8 + lVar30) != (void *)0x0) {
      crnlib_free(*(void **)((long)local_c8 + lVar30));
    }
    if (*(void **)((long)local_d8 + lVar30) != (void *)0x0) {
      crnlib_free(*(void **)((long)local_d8 + lVar30));
    }
    lVar30 = lVar30 + -0x28;
  } while (lVar30 != -0x28);
  if (local_118.m_p != (void *)0x0) {
    crnlib_free(local_118.m_p);
  }
  if (local_128.m_p != (void *)0x0) {
    crnlib_free(local_128.m_p);
  }
  if (local_108.m_p != (void *)0x0) {
    crnlib_free(local_108.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha() {
  uint16 n = m_alpha_endpoints.size();
  crnlib::vector<uint> hist(n * n);
  crnlib::vector<uint> sum(n);
  bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
  for (uint i0, i1, i0_prev = 0, i1_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i0_prev = i0, i1_prev = i1) {
    i0 = m_endpoint_indices[b].alpha0;
    i1 = m_endpoint_indices[b].alpha1;    
    if (!m_endpoint_indices[b].reference) {
      if (hasAlpha0 && i0 != i0_prev) {
        hist[i0 * n + i0_prev]++;
        hist[i0_prev * n + i0]++;
        sum[i0]++;
        sum[i0_prev]++;
      }
      if (hasAlpha1 && i1 != i1_prev) {
        hist[i1 * n + i1_prev]++;
        hist[i1_prev * n + i1]++;
        sum[i1]++;
        sum[i1_prev]++;
      }
    }
  }
  uint16 selected = 0;
  uint best_sum = 0;
  for (uint16 i = 0; i < n; i++) {
    if (best_sum < sum[i]) {
      best_sum = sum[i];
      selected = i;
    }
  }
  crnlib::vector<optimize_alpha_params::unpacked_endpoint> unpacked_endpoints(n);
  for (uint16 i = 0; i < n; i++) {
    unpacked_endpoints[i].low = dxt5_block::unpack_endpoint(m_alpha_endpoints[i], 0);
    unpacked_endpoints[i].high = dxt5_block::unpack_endpoint(m_alpha_endpoints[i], 1);
  }

  optimize_alpha_params::result remapping_trial[4];
  float weights[4] = {0, 0, 1.0f / 6.0f, 0.5f};
  for (uint i = 0; i < 4; i++) {
    optimize_alpha_params* pParams = crnlib_new<optimize_alpha_params>();
    pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
    pParams->hist = hist.get_ptr();
    pParams->n = n;
    pParams->selected = selected;
    pParams->weight = weights[i];
    pParams->pResult = remapping_trial + i;
    m_task_pool.queue_object_task(this, &crn_comp::optimize_alpha_endpoints_task, i, pParams);
  }
  m_task_pool.join();

  for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++) {
    if (remapping_trial[i].total_bits < best_bits) {
      m_packed_alpha_endpoints.swap(remapping_trial[i].packed_endpoints);
      m_endpoint_remaping[cAlpha0].swap(remapping_trial[i].endpoint_remapping);
      best_bits = remapping_trial[i].total_bits;
    }
  }
}